

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdtr.c
# Opt level: O0

double hcephes_bdtrc(int k,int n,double p)

{
  double dVar1;
  double dVar2;
  double dn;
  double dk;
  double p_local;
  int n_local;
  int k_local;
  
  if ((0.0 <= p) && (p <= 1.0)) {
    if (k < 0) {
      return 1.0;
    }
    if (k <= n) {
      if (k == n) {
        return 0.0;
      }
      dVar1 = (double)(n - k);
      if (k == 0) {
        if (0.01 <= p) {
          dVar1 = pow(1.0 - p,dVar1);
          dn = 1.0 - dVar1;
        }
        else {
          dVar2 = hcephes_log1p(-p);
          dVar1 = hcephes_expm1(dVar1 * dVar2);
          dn = -dVar1;
        }
      }
      else {
        dn = hcephes_incbet((double)(k + 1),dVar1,p);
      }
      return dn;
    }
  }
  hcephes_mtherr("bdtrc",1);
  return 0.0;
}

Assistant:

HCEPHES_API double hcephes_bdtrc(int k, int n, double p) {
    double dk, dn;

    if ((p < 0.0) || (p > 1.0))
        goto domerr;
    if (k < 0)
        return (1.0);

    if (n < k) {
    domerr:
        hcephes_mtherr("bdtrc", HCEPHES_DOMAIN);
        return (0.0);
    }

    if (k == n)
        return (0.0);
    dn = n - k;
    if (k == 0) {
        if (p < .01)
            dk = -hcephes_expm1(dn * hcephes_log1p(-p));
        else
            dk = 1.0 - pow(1.0 - p, dn);
    } else {
        dk = k + 1;
        dk = hcephes_incbet(dk, dn, p);
    }
    return (dk);
}